

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffer.cpp
# Opt level: O1

void __thiscall char_buffer_compare_Test::~char_buffer_compare_Test(char_buffer_compare_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(char_buffer, compare)
{
    // Same length, chars
    EXPECT_EQ(0, ST_CHAR_LITERAL("abc").compare("abc"));
    EXPECT_GT(0, ST_CHAR_LITERAL("abc").compare("abd"));
    EXPECT_LT(0, ST_CHAR_LITERAL("abc").compare("abb"));
    EXPECT_GT(0, ST_CHAR_LITERAL("abC").compare("abc"));
    EXPECT_GT(0, ST_CHAR_LITERAL("Abc").compare("abc"));
    EXPECT_EQ(0, ST::char_buffer().compare(""));
    EXPECT_EQ(0, ST::char_buffer().compare(nullptr));

    // Same length, wchars
    EXPECT_EQ(0, ST_WCHAR_LITERAL(L"abc").compare(L"abc"));
    EXPECT_GT(0, ST_WCHAR_LITERAL(L"abc").compare(L"abd"));
    EXPECT_LT(0, ST_WCHAR_LITERAL(L"abc").compare(L"abb"));
    EXPECT_GT(0, ST_WCHAR_LITERAL(L"abC").compare(L"abc"));
    EXPECT_GT(0, ST_WCHAR_LITERAL(L"Abc").compare(L"abc"));
    EXPECT_EQ(0, ST::wchar_buffer().compare(L""));
    EXPECT_EQ(0, ST::wchar_buffer().compare(nullptr));

    // Mismatched length, chars
    EXPECT_LT(0, ST_CHAR_LITERAL("abc").compare("ab"));
    EXPECT_GT(0, ST_CHAR_LITERAL("abc").compare("abcd"));
    EXPECT_LT(0, ST_CHAR_LITERAL("abc").compare(""));
    EXPECT_LT(0, ST_CHAR_LITERAL("abc").compare(nullptr));
    EXPECT_GT(0, ST::char_buffer().compare("abc"));

    // Mismatched length, wchars
    EXPECT_LT(0, ST_WCHAR_LITERAL(L"abc").compare(L"ab"));
    EXPECT_GT(0, ST_WCHAR_LITERAL(L"abc").compare(L"abcd"));
    EXPECT_LT(0, ST_WCHAR_LITERAL(L"abc").compare(L""));
    EXPECT_LT(0, ST_WCHAR_LITERAL(L"abc").compare(nullptr));
    EXPECT_GT(0, ST::wchar_buffer().compare(L"abc"));
}